

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_base64.c
# Opt level: O1

void * uo_base64_decode(void *dst,char *src,size_t src_len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar *a;
  byte *pbVar4;
  uchar *b;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  
  pbVar5 = (byte *)((long)dst + 1);
  pbVar4 = (byte *)src;
  while ((pbVar4 + 4 < src + src_len ||
         ((uVar7 = (ulong)pbVar4[2], uVar7 != 0x3d && (pbVar4[3] != 0x3d))))) {
    bVar1 = atob[pbVar4[1]];
    bVar2 = atob[pbVar4[2]];
    bVar3 = pbVar4[3];
    pbVar5[-1] = bVar1 >> 4 | atob[*pbVar4] << 2;
    *pbVar5 = bVar2 >> 2 | bVar1 << 4;
    pbVar5[1] = bVar2 << 6 | atob[bVar3];
    pbVar5 = pbVar5 + 3;
    pbVar4 = pbVar4 + 4;
  }
  pbVar6 = pbVar5 + -1;
  if (pbVar4 < src + src_len) {
    bVar1 = atob[pbVar4[1]];
    bVar2 = atob[uVar7];
    pbVar5[-1] = bVar1 >> 4 | atob[*pbVar4] << 2;
    pbVar6 = pbVar5;
    if (uVar7 != 0x3d) {
      *pbVar5 = bVar2 >> 2 | bVar1 << 4;
      pbVar6 = pbVar5 + 1;
    }
  }
  return pbVar6;
}

Assistant:

void *uo_base64_decode(
    void *dst, 
    const char *src, 
    size_t src_len)
{
    unsigned char *b = (unsigned char *)dst;
    const unsigned char *a = (unsigned char *)src;
    const unsigned char *end = a + src_len;
    unsigned char a0, a1, a2, a3;

    while (a + 4 < end || a[2] != '=' && a[3] != '=')
    {
        a0 = atob[*a++];
        a1 = atob[*a++];
        a2 = atob[*a++];
        a3 = atob[*a++];

        *b++ = a0 << 2 | a1 >> 4;
        *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
        *b++ = (a2 & 0x03) << 6 | a3;
    }

    if (a < end)
    {
        a0 = atob[*a++];
        a1 = atob[*a++];
        a2 = atob[*a++];

        *b++ = a0 << 2 | a1 >> 4;

        if (a2 != (unsigned char)0x40)
            *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
    }

    return b;
}